

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> * __thiscall
nonius::estimate::operator_cast_to_estimate
          (estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *in_RDI;
  
  dVar1 = (this->upper_bound).__r;
  dVar2 = this->confidence_interval;
  dVar3 = (this->lower_bound).__r;
  (in_RDI->point).__r = (this->point).__r * 1e-09;
  (in_RDI->lower_bound).__r = dVar3 * 1e-09;
  (in_RDI->upper_bound).__r = dVar1 * 1e-09;
  in_RDI->confidence_interval = dVar2;
  return in_RDI;
}

Assistant:

operator estimate<Duration2>() const {
            return estimate<Duration2>{ point, lower_bound, upper_bound, confidence_interval };
        }